

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O0

void process_restart(j_decompress_ptr cinfo)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long *in_RDI;
  jpeg_component_info *compptr;
  int ci;
  arith_entropy_ptr_conflict entropy;
  int local_14;
  
  lVar1 = in_RDI[0x4a];
  iVar3 = (**(code **)(in_RDI[0x49] + 0x10))(in_RDI);
  if (iVar3 == 0) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x18;
    (**(code **)*in_RDI)(in_RDI);
  }
  for (local_14 = 0; local_14 < (int)in_RDI[0x36]; local_14 = local_14 + 1) {
    lVar2 = in_RDI[(long)local_14 + 0x37];
    if (((int)in_RDI[0x27] == 0) ||
       ((*(int *)((long)in_RDI + 0x20c) == 0 && (*(int *)((long)in_RDI + 0x214) == 0)))) {
      memset(*(void **)(lVar1 + 0x50 + (long)*(int *)(lVar2 + 0x14) * 8),0,0x40);
      *(undefined4 *)(lVar1 + 0x2c + (long)local_14 * 4) = 0;
      *(undefined4 *)(lVar1 + 0x3c + (long)local_14 * 4) = 0;
    }
    if (((int)in_RDI[0x27] == 0) || (*(int *)((long)in_RDI + 0x20c) != 0)) {
      memset(*(void **)(lVar1 + 0xd0 + (long)*(int *)(lVar2 + 0x18) * 8),0,0x100);
    }
  }
  *(undefined8 *)(lVar1 + 0x18) = 0;
  *(undefined8 *)(lVar1 + 0x20) = 0;
  *(undefined4 *)(lVar1 + 0x28) = 0xfffffff0;
  *(int *)(lVar1 + 0x4c) = (int)in_RDI[0x2e];
  return;
}

Assistant:

LOCAL(void)
process_restart(j_decompress_ptr cinfo)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  int ci;
  jpeg_component_info *compptr;

  /* Advance past the RSTn marker */
  if (!(*cinfo->marker->read_restart_marker) (cinfo))
    ERREXIT(cinfo, JERR_CANT_SUSPEND);

  /* Re-initialize statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    if (!cinfo->progressive_mode || (cinfo->Ss == 0 && cinfo->Ah == 0)) {
      MEMZERO(entropy->dc_stats[compptr->dc_tbl_no], DC_STAT_BINS);
      /* Reset DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    if (!cinfo->progressive_mode || cinfo->Ss) {
      MEMZERO(entropy->ac_stats[compptr->ac_tbl_no], AC_STAT_BINS);
    }
  }

  /* Reset arithmetic decoding variables */
  entropy->c = 0;
  entropy->a = 0;
  entropy->ct = -16;    /* force reading 2 initial bytes to fill C */

  /* Reset restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;
}